

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus
assessBounds(HighsOptions *options,char *type,HighsInt ml_ix_os,
            HighsIndexCollection *index_collection,vector<double,_std::allocator<double>_> *lower,
            vector<double,_std::allocator<double>_> *upper,double infinite_bound,
            HighsVarType *integrality)

{
  double dVar1;
  HighsLogOptions *log_options_;
  bool bVar2;
  byte bVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  const_reference pvVar7;
  reference pvVar8;
  char *pcVar9;
  HighsIndexCollection *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  HighsLogOptions *in_XMM0_Qa;
  long in_stack_00000008;
  bool legalUpperBound;
  bool legalLowerBound;
  bool legalLowerUpperBound;
  bool infinite_upper_bound;
  bool infinite_lower_bound;
  HighsInt k;
  HighsInt usr_ix;
  HighsInt ml_ix;
  HighsInt local_ix;
  HighsInt num_infinite_upper_bound;
  HighsInt num_infinite_lower_bound;
  bool warning_found;
  bool error_found;
  HighsInt to_k;
  HighsInt from_k;
  HighsStatus return_status;
  int local_68;
  int local_64;
  int local_5c;
  uint local_58;
  uint local_54;
  int local_4c;
  int local_48;
  HighsStatus local_44;
  HighsLogOptions *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  vector<double,_std::allocator<double>_> *local_30;
  HighsIndexCollection *local_28;
  int local_1c;
  undefined8 local_18;
  long local_10;
  HighsStatus local_4;
  
  local_44 = 0;
  local_40 = in_XMM0_Qa;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  limits(in_RCX,&local_48,&local_4c);
  if (local_4c < local_48) {
    local_4 = kOk;
  }
  else {
    local_44 = 0;
    bVar2 = false;
    bVar3 = 0;
    local_54 = 0;
    local_58 = 0;
    local_64 = -1;
    for (local_68 = local_48; local_68 < local_4c + 1; local_68 = local_68 + 1) {
      if (((local_28->is_interval_ & 1U) == 0) && ((local_28->is_mask_ & 1U) == 0)) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->set_,(long)local_68);
        local_5c = *pvVar7;
      }
      else {
        local_5c = local_68;
      }
      if ((local_28->is_interval_ & 1U) == 0) {
        local_64 = local_68;
      }
      else {
        local_64 = local_64 + 1;
      }
      uVar6 = local_1c + local_5c;
      if (((local_28->is_mask_ & 1U) == 0) ||
         (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_28->mask_,(long)local_5c), *pvVar7 != 0)) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64);
        bVar5 = highs_isInfinity(-*pvVar8);
        if ((!bVar5) &&
           (pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_30,(long)local_64), *pvVar8 <= -(double)local_40)) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64)
          ;
          *pvVar8 = -INFINITY;
          local_54 = local_54 + 1;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64);
        bVar5 = highs_isInfinity(*pvVar8);
        if ((!bVar5) &&
           (pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_38,(long)local_64), (double)local_40 <= *pvVar8)) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64)
          ;
          *pvVar8 = INFINITY;
          local_58 = local_58 + 1;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64);
        dVar1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64);
        uVar4 = local_18;
        bVar5 = dVar1 <= *pvVar8;
        if ((in_stack_00000008 != 0) &&
           ((*(char *)(in_stack_00000008 + local_64) == '\x02' ||
            (*(char *)(in_stack_00000008 + local_64) == '\x03')))) {
          bVar5 = true;
        }
        if (!bVar5) {
          pcVar9 = (char *)(local_10 + 0x380);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64)
          ;
          log_options_ = (HighsLogOptions *)*pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64)
          ;
          highsLogUser(log_options_,(HighsLogType)*pvVar8,pcVar9,4,
                       "%3s  %12d has inconsistent bounds [%12g, %12g]\n",uVar4,(ulong)uVar6);
          bVar3 = 1;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64);
        uVar4 = local_18;
        if ((double)local_40 <= *pvVar8) {
          pcVar9 = (char *)(local_10 + 0x380);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64)
          ;
          highsLogUser((HighsLogOptions *)*pvVar8,(HighsLogType)local_40,pcVar9,5,
                       "%3s  %12d has lower bound of %12g >= %12g\n",uVar4,(ulong)uVar6);
          bVar2 = true;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64);
        uVar4 = local_18;
        if (*pvVar8 <= -(double)local_40) {
          pcVar9 = (char *)(local_10 + 0x380);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_64)
          ;
          highsLogUser((HighsLogOptions *)*pvVar8,(HighsLogType)-(double)local_40,pcVar9,5,
                       "%3s  %12d has upper bound of %12g <= %12g\n",uVar4,(ulong)uVar6);
          bVar2 = true;
        }
      }
    }
    if (local_54 != 0) {
      highsLogUser((HighsLogOptions *)((ulong)local_40 ^ 0x8000000000000000),
                   (HighsLogType)(local_10 + 0x380),(char *)0x1,
                   "%3ss:%12d lower bounds    less than or equal to %12g are treated as -Infinity\n"
                   ,local_18,(ulong)local_54);
    }
    if (local_58 != 0) {
      highsLogUser(local_40,(HighsLogType)(local_10 + 0x380),(char *)0x1,
                   "%3ss:%12d upper bounds greater than or equal to %12g are treated as +Infinity\n"
                   ,local_18,(ulong)local_58);
    }
    if (bVar2) {
      local_44 = kError;
    }
    else {
      local_44 = (HighsStatus)bVar3;
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

HighsStatus assessBounds(const HighsOptions& options, const char* type,
                         const HighsInt ml_ix_os,
                         const HighsIndexCollection& index_collection,
                         vector<double>& lower, vector<double>& upper,
                         const double infinite_bound,
                         const HighsVarType* integrality) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return HighsStatus::kOk;

  return_status = HighsStatus::kOk;
  bool error_found = false;
  bool warning_found = false;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the row/column
  // indices to be considered in a local sense, as well as the entries
  // in the lower and upper bound data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the indices to be considered in a local sense are
  // drawn. The entries in the lower and
  // upper bound data to be assessed correspond to the values of
  // k.
  //
  // Adding the value of ml_ix_os to local_ix yields the value of
  // ml_ix, being the index in a global (whole-model) sense. This is
  // necessary when assessing the bounds of rows/columns being added
  // to a model, since they are specified using an interval
  // [0...num_new_row/col) which must be offset by the current number
  // of rows/columns (generically indices) in the model.
  //
  HighsInt num_infinite_lower_bound = 0;
  HighsInt num_infinite_upper_bound = 0;
  HighsInt local_ix;
  HighsInt ml_ix;
  HighsInt usr_ix = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_ix = k;
    } else {
      local_ix = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_ix++;
    } else {
      usr_ix = k;
    }
    ml_ix = ml_ix_os + local_ix;
    if (index_collection.is_mask_ && !index_collection.mask_[local_ix])
      continue;

    if (!highs_isInfinity(-lower[usr_ix])) {
      // Check whether a finite lower bound will be treated as -Infinity
      bool infinite_lower_bound = lower[usr_ix] <= -infinite_bound;
      if (infinite_lower_bound) {
        lower[usr_ix] = -kHighsInf;
        num_infinite_lower_bound++;
      }
    }
    if (!highs_isInfinity(upper[usr_ix])) {
      // Check whether a finite upper bound will be treated as Infinity
      bool infinite_upper_bound = upper[usr_ix] >= infinite_bound;
      if (infinite_upper_bound) {
        upper[usr_ix] = kHighsInf;
        num_infinite_upper_bound++;
      }
    }
    // Check that the lower bound does not exceed the upper bound
    bool legalLowerUpperBound = lower[usr_ix] <= upper[usr_ix];
    if (integrality) {
      // Legal for semi-variables to have inconsistent bounds
      if (integrality[usr_ix] == HighsVarType::kSemiContinuous ||
          integrality[usr_ix] == HighsVarType::kSemiInteger)
        legalLowerUpperBound = true;
    }
    if (!legalLowerUpperBound) {
      // Leave inconsistent bounds to be used to deduce infeasibility
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has inconsistent bounds [%12g, %12g]\n",
                   type, ml_ix, lower[usr_ix], upper[usr_ix]);
      warning_found = true;
    }
    // Check that the lower bound is not as much as +Infinity
    bool legalLowerBound = lower[usr_ix] < infinite_bound;
    if (!legalLowerBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has lower bound of %12g >= %12g\n",
                   type, ml_ix, lower[usr_ix], infinite_bound);
      error_found = true;
    }
    // Check that the upper bound is not as little as -Infinity
    bool legalUpperBound = upper[usr_ix] > -infinite_bound;
    if (!legalUpperBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has upper bound of %12g <= %12g\n",
                   type, ml_ix, upper[usr_ix], -infinite_bound);
      error_found = true;
    }
  }
  if (num_infinite_lower_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " lower bounds    less than or equal to %12g are treated as "
                 "-Infinity\n",
                 type, num_infinite_lower_bound, -infinite_bound);
  }
  if (num_infinite_upper_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " upper bounds greater than or equal to %12g are treated as "
                 "+Infinity\n",
                 type, num_infinite_upper_bound, infinite_bound);
  }

  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}